

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUUtils.cpp
# Opt level: O2

String * COLLADABU::Utils::replaceDot(String *__return_storage_ptr__,String *text)

{
  char cVar1;
  char cVar2;
  size_t i;
  ulong uVar3;
  stringstream stream;
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  for (uVar3 = 0; uVar3 < text->_M_string_length; uVar3 = uVar3 + 1) {
    cVar1 = (text->_M_dataplus)._M_p[uVar3];
    cVar2 = '_';
    if (cVar1 != '.') {
      cVar2 = cVar1;
    }
    std::operator<<(local_1a0,cVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return __return_storage_ptr__;
}

Assistant:

String Utils::replaceDot ( const String &text )
    {
        std::stringstream stream;

        for ( size_t i = 0; i < text.length(); ++i )
        {
            if ( text[i] == '.' )
                stream << '_';
            else
                stream << text[i];
        }

        return stream.str();
    }